

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidget.h
# Opt level: O2

QRect __thiscall QWidget::normalGeometry(QWidget *this)

{
  QWidgetData *pQVar1;
  QTLWExtra *pQVar2;
  ulong uVar3;
  undefined8 uVar4;
  ulong uVar5;
  QRect QVar6;
  
  pQVar1 = this->data;
  if (((pQVar1->window_flags).super_QFlagsStorageHelper<Qt::WindowType,_4>.
       super_QFlagsStorage<Qt::WindowType>.i & 1) == 0) {
    uVar4 = 0xffffffffffffffff;
    uVar5 = 0;
    uVar3 = 0;
  }
  else {
    if ((pQVar1->field_0x10 & 6) == 0) {
      uVar3._0_4_ = (pQVar1->crect).x1;
      uVar3._4_4_ = (pQVar1->crect).y1;
      uVar4._0_4_ = (pQVar1->crect).x2;
      uVar4._4_4_ = (pQVar1->crect).y2;
    }
    else {
      pQVar2 = QWidgetPrivate::topData(*(QWidgetPrivate **)&this->field_0x8);
      uVar3._0_4_ = (pQVar2->normalGeometry).x1;
      uVar3._4_4_ = (pQVar2->normalGeometry).y1;
      uVar4._0_4_ = (pQVar2->normalGeometry).x2;
      uVar4._4_4_ = (pQVar2->normalGeometry).y2;
    }
    uVar5 = uVar3 & 0xffffffff00000000;
  }
  QVar6._0_8_ = uVar3 & 0xffffffff | uVar5;
  QVar6.x2.m_i = (int)uVar4;
  QVar6.y2.m_i = (int)((ulong)uVar4 >> 0x20);
  return QVar6;
}

Assistant:

inline Qt::WindowType QWidget::windowType() const
{ return static_cast<Qt::WindowType>((data->window_flags & Qt::WindowType_Mask).toInt()); }